

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::MatchesRegexMatcher::DescribeTo(MatchesRegexMatcher *this,ostream *os)

{
  ostream *poVar1;
  RE *this_00;
  ostream *in_RSI;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *in_stack_ffffffffffffff98;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  pcVar2 = "contains";
  if (((in_RDI->field_2)._M_local_buf[0] & 1U) != 0) {
    pcVar2 = "matches";
  }
  poVar1 = std::operator<<(in_RSI,pcVar2);
  std::operator<<(poVar1," regular expression ");
  this_00 = linked_ptr<const_testing::internal::RE>::operator->
                      ((linked_ptr<const_testing::internal::RE> *)in_RDI);
  RE::pattern(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  UniversalPrinter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Print(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DescribeTo(::std::ostream* os) const {
    *os << (full_match_ ? "matches" : "contains")
        << " regular expression ";
    UniversalPrinter<internal::string>::Print(regex_->pattern(), os);
  }